

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O3

int archive_compressor_gzip_options(archive_write_filter *f,char *key,char *value)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  
  puVar1 = (uint *)f->data;
  iVar2 = strcmp(key,"compression-level");
  if (iVar2 == 0) {
    iVar2 = -0x14;
    if (((value != (char *)0x0) && ((byte)(*value - 0x30U) < 10)) && (value[1] == '\0')) {
      *puVar1 = (uint)(byte)(*value - 0x30U);
      iVar2 = 0;
    }
  }
  else {
    iVar3 = strcmp(key,"timestamp");
    iVar2 = -0x14;
    if (iVar3 == 0) {
      iVar2 = 0;
      puVar1[1] = -(uint)(value == (char *)0x0) | 1;
    }
  }
  return iVar2;
}

Assistant:

static int
archive_compressor_gzip_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		if (value == NULL || !(value[0] >= '0' && value[0] <= '9') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->compression_level = value[0] - '0';
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "timestamp") == 0) {
		data->timestamp = (value == NULL)?-1:1;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}